

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ReservedExtensionRangeAdjacent_Test::
TestBody(ValidationErrorTest_ReservedExtensionRangeAdjacent_Test *this)

{
  string_view local_20;
  ValidationErrorTest_ReservedExtensionRangeAdjacent_Test *local_10;
  ValidationErrorTest_ReservedExtensionRangeAdjacent_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "name: \"foo.proto\" message_type {  name: \"Foo\"  extension_range { start: 10 end: 20 }  reserved_range { start: 5 end: 10 }}"
            );
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,local_20);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ReservedExtensionRangeAdjacent) {
  BuildFile(
      "name: \"foo.proto\" "
      "message_type {"
      "  name: \"Foo\""
      "  extension_range { start: 10 end: 20 }"
      "  reserved_range { start: 5 end: 10 }"
      "}");
}